

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall ON_wString::Mid(ON_wString *this,int i,int count)

{
  int iVar1;
  int in_ECX;
  undefined4 in_register_00000034;
  ON_wString *this_00;
  int local_20;
  int count_local;
  int i_local;
  ON_wString *this_local;
  ON_wString *s;
  
  this_00 = (ON_wString *)CONCAT44(in_register_00000034,i);
  if (((-1 < count) && (iVar1 = Length(this_00), count < iVar1)) && (0 < in_ECX)) {
    iVar1 = Length(this_00);
    local_20 = in_ECX;
    if (iVar1 - count < in_ECX) {
      local_20 = Length(this_00);
      local_20 = local_20 - count;
    }
    if (0 < local_20) {
      ON_wString(this);
      CopyToArray(this,local_20,this_00->m_s + count);
      return (ON_wString)(wchar_t *)this;
    }
  }
  ON_wString(this,&EmptyString);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_wString::Mid(int i, int count) const
{
  if ( i >= 0 && i < Length() && count > 0 )
  {
    if ( count > Length() - i )
      count = Length() - i;
    if (count > 0)
    {
      ON_wString s;
      s.CopyToArray(count, &m_s[i]);
      return s;
    }
  }
  return ON_wString::EmptyString;
}